

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmHexFileConverter.cxx
# Opt level: O1

FileType cmHexFileConverter::DetermineFileType(string *inFileName)

{
  uint uVar1;
  int iVar2;
  FILE *__stream;
  char *pcVar3;
  FileType FVar4;
  FileType FVar5;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  char buf [1024];
  char local_428 [1032];
  
  __stream = (FILE *)cmsys::SystemTools::Fopen(inFileName,"rb");
  FVar4 = Binary;
  if (__stream != (FILE *)0x0) {
    pcVar3 = fgets(local_428,0x400,__stream);
    if (pcVar3 == (char *)0x0) {
      local_428[0] = '\0';
    }
    fclose(__stream);
    if (local_428[0] == ':') {
      uVar6 = 0x20b;
      uVar7 = 0xb;
      FVar5 = IntelHex;
    }
    else {
      if (local_428[0] != 'S') {
        return Binary;
      }
      uVar6 = 0x20e;
      uVar7 = 10;
      FVar5 = MotorolaSrec;
    }
    uVar1 = ChompStrlen(local_428);
    FVar4 = Binary;
    if ((uVar1 <= uVar6 && uVar7 <= uVar1) && (FVar4 = FVar5, 1 < uVar1)) {
      uVar8 = 1;
      do {
        iVar2 = isxdigit((int)local_428[uVar8]);
        if (iVar2 == 0) {
          return Binary;
        }
        uVar8 = uVar8 + 1;
      } while (uVar1 != uVar8);
    }
  }
  return FVar4;
}

Assistant:

cmHexFileConverter::FileType cmHexFileConverter::DetermineFileType(
  const std::string& inFileName)
{
  char buf[1024];
  FILE* inFile = cmsys::SystemTools::Fopen(inFileName, "rb");
  if (inFile == nullptr) {
    return Binary;
  }

  if (!fgets(buf, 1024, inFile)) {
    buf[0] = 0;
  }
  fclose(inFile);
  FileType type = Binary;
  unsigned int minLineLength = 0;
  unsigned int maxLineLength = 0;
  if (buf[0] == ':') // might be an intel hex file
  {
    type = IntelHex;
    minLineLength = INTEL_HEX_MIN_LINE_LENGTH;
    maxLineLength = INTEL_HEX_MAX_LINE_LENGTH;
  } else if (buf[0] == 'S') // might be a motorola srec file
  {
    type = MotorolaSrec;
    minLineLength = MOTOROLA_SREC_MIN_LINE_LENGTH;
    maxLineLength = MOTOROLA_SREC_MAX_LINE_LENGTH;
  } else {
    return Binary;
  }

  unsigned int slen = ChompStrlen(buf);
  if ((slen < minLineLength) || (slen > maxLineLength)) {
    return Binary;
  }

  for (unsigned int i = 1; i < slen; i++) {
    if (!isxdigit(buf[i])) {
      return Binary;
    }
  }
  return type;
}